

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.cpp
# Opt level: O0

void __thiscall HuffmanDecoder::run(HuffmanDecoder *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  reference pvVar8;
  HuffmanNode *pHVar9;
  element_type *this_00;
  list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_> *this_01;
  bool local_431;
  string local_3f0;
  byte local_3c9;
  undefined1 local_3c8 [32];
  undefined1 local_3a8 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_388;
  char *c;
  iterator __end1_1;
  iterator __begin1_1;
  string local_350 [32];
  string *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range1_1;
  stringstream output;
  ostream local_318 [376];
  undefined1 local_1a0 [8];
  value_type root;
  shared_ptr<HuffmanNode> parent;
  value_type right_son;
  value_type left_son;
  undefined1 local_158 [8];
  shared_ptr<HuffmanNode> node;
  pair<const_char,_int> *symbol;
  iterator __end1;
  iterator __begin1;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *__range1;
  string local_120;
  undefined1 local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_freq;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_char;
  int freq_index;
  int char_index;
  int i;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> symbols;
  int amount;
  string local_50;
  undefined1 local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_amount;
  HuffmanDecoder *this_local;
  
  s_amount.field_2._8_8_ = this;
  poVar5 = std::operator<<((ostream *)&std::cout,"Huffman decryption...");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Cryptor::get_in_message_abi_cxx11_(&local_50,&this->super_Cryptor);
  std::__cxx11::string::substr((ulong)local_30,(ulong)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  symbols._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       std::__cxx11::stoi((string *)local_30,(size_t *)0x0,2);
  std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::map
            ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)
             &char_index);
  for (freq_index = 0;
      SBORROW4(freq_index,(int)symbols._M_t._M_impl.super__Rb_tree_header._M_node_count * 2) !=
      freq_index + (int)symbols._M_t._M_impl.super__Rb_tree_header._M_node_count * -2 < 0;
      freq_index = freq_index + 2) {
    s_char.field_2._12_4_ = freq_index * 8 + 0x10;
    Cryptor::get_in_message_abi_cxx11_((string *)((long)&s_freq.field_2 + 8),&this->super_Cryptor);
    std::__cxx11::string::substr((ulong)local_c0,(ulong)((long)&s_freq.field_2 + 8));
    std::__cxx11::string::~string((string *)(s_freq.field_2._M_local_buf + 8));
    Cryptor::get_in_message_abi_cxx11_(&local_120,&this->super_Cryptor);
    std::__cxx11::string::substr((ulong)local_100,(ulong)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    iVar3 = std::__cxx11::stoi((string *)local_100,(size_t *)0x0,2);
    iVar4 = std::__cxx11::stoi((string *)local_c0,(size_t *)0x0,2);
    __range1._7_1_ = (undefined1)iVar4;
    pmVar6 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                         *)&char_index,(key_type *)((long)&__range1 + 7));
    *pmVar6 = iVar3;
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_c0);
  }
  __end1 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::begin
                     ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                       *)&char_index);
  symbol = (pair<const_char,_int> *)
           std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::end
                     ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                       *)&char_index);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&symbol), bVar1) {
    node.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator*(&__end1);
    pHVar9 = (HuffmanNode *)operator_new(0x28);
    HuffmanNode::HuffmanNode
              (pHVar9,*(char *)&(node.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base,
               *(int *)((long)&(node.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + 4));
    std::shared_ptr<HuffmanNode>::shared_ptr<HuffmanNode,void>
              ((shared_ptr<HuffmanNode> *)local_158,pHVar9);
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::push_back(&this->nodes_,(value_type *)local_158);
    std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)local_158);
    std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator++(&__end1);
  }
  while (sVar7 = std::__cxx11::
                 list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                 ::size(&this->nodes_), 1 < sVar7) {
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::sort<HuffmanComparator>(&this->nodes_);
    this_01 = &this->nodes_;
    pvVar8 = std::__cxx11::
             list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
             front(this_01);
    std::shared_ptr<HuffmanNode>::shared_ptr
              ((shared_ptr<HuffmanNode> *)
               &right_son.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               pvVar8);
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::pop_front(this_01);
    pvVar8 = std::__cxx11::
             list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
             front(this_01);
    std::shared_ptr<HuffmanNode>::shared_ptr
              ((shared_ptr<HuffmanNode> *)
               &parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               pvVar8);
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::pop_front(this_01);
    pHVar9 = (HuffmanNode *)operator_new(0x28);
    HuffmanNode::HuffmanNode
              (pHVar9,(shared_ptr<HuffmanNode> *)
                      &right_son.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,
               (shared_ptr<HuffmanNode> *)
               &parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<HuffmanNode>::shared_ptr<HuffmanNode,void>
              ((shared_ptr<HuffmanNode> *)
               &root.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pHVar9)
    ;
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::push_back(&this->nodes_,
                (value_type *)
                &root.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<HuffmanNode>::~shared_ptr
              ((shared_ptr<HuffmanNode> *)
               &root.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<HuffmanNode>::~shared_ptr
              ((shared_ptr<HuffmanNode> *)
               &parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<HuffmanNode>::~shared_ptr
              ((shared_ptr<HuffmanNode> *)
               &right_son.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  pvVar8 = std::__cxx11::
           list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::front
                     (&this->nodes_);
  std::shared_ptr<HuffmanNode>::shared_ptr((shared_ptr<HuffmanNode> *)local_1a0,pvVar8);
  std::__cxx11::stringstream::stringstream((stringstream *)&__range1_1);
  Cryptor::get_in_message_abi_cxx11_((string *)&__begin1_1,&this->super_Cryptor);
  std::__cxx11::string::substr((ulong)local_350,(ulong)&__begin1_1);
  std::__cxx11::string::~string((string *)&__begin1_1);
  local_330 = local_350;
  __end1_1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&c), bVar1) {
    local_388._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1_1);
    if (*(char *)&(local_388._M_pi)->_vptr__Sp_counted_base == '0') {
      std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_1a0);
      HuffmanNode::get_left((HuffmanNode *)(local_3a8 + 0x10));
      std::shared_ptr<HuffmanNode>::operator=
                ((shared_ptr<HuffmanNode> *)local_1a0,(shared_ptr<HuffmanNode> *)(local_3a8 + 0x10))
      ;
      std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)(local_3a8 + 0x10));
    }
    else if (*(char *)&(local_388._M_pi)->_vptr__Sp_counted_base == '1') {
      std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_1a0);
      HuffmanNode::get_right((HuffmanNode *)local_3a8);
      std::shared_ptr<HuffmanNode>::operator=
                ((shared_ptr<HuffmanNode> *)local_1a0,(shared_ptr<HuffmanNode> *)local_3a8);
      std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)local_3a8);
    }
    std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_1a0);
    local_3c9 = 0;
    HuffmanNode::get_right((HuffmanNode *)(local_3c8 + 0x10));
    bVar1 = std::operator==((shared_ptr<HuffmanNode> *)(local_3c8 + 0x10),(nullptr_t)0x0);
    local_431 = false;
    if (bVar1) {
      std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_1a0);
      HuffmanNode::get_left((HuffmanNode *)local_3c8);
      local_3c9 = 1;
      local_431 = std::operator==((shared_ptr<HuffmanNode> *)local_3c8,(nullptr_t)0x0);
    }
    if ((local_3c9 & 1) != 0) {
      std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)local_3c8);
    }
    std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)(local_3c8 + 0x10));
    if (local_431 != false) {
      this_00 = std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1a0);
      cVar2 = HuffmanNode::get_c(this_00);
      poVar5 = std::operator<<(local_318,cVar2);
      std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
      pvVar8 = std::__cxx11::
               list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
               front(&this->nodes_);
      std::shared_ptr<HuffmanNode>::operator=((shared_ptr<HuffmanNode> *)local_1a0,pvVar8);
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  std::__cxx11::string::~string(local_350);
  std::__cxx11::stringstream::str();
  Cryptor::set_out_message(&this->super_Cryptor,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  poVar5 = std::operator<<((ostream *)&std::cout,"decryption done!");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range1_1);
  std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)local_1a0);
  std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::~map
            ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)
             &char_index);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void HuffmanDecoder::run() {
  cout << "Huffman decryption..." << endl;

  const auto s_amount = get_in_message().substr(0, 8);
  const auto amount = stoi(s_amount, nullptr, 2);
  map<char, int> symbols;
  for (auto i = 0; i < amount * 2; i += 2) {
    const auto char_index = 8 * (i + 1);
    const auto freq_index = 8 * (i + 2);
    auto s_char = get_in_message().substr(static_cast<unsigned long>(char_index), 8);
    auto s_freq = get_in_message().substr(static_cast<unsigned long>(freq_index), 8);
    symbols[stoi(s_char, nullptr, 2)] = stoi(s_freq, nullptr, 2);
  }

  for (auto& symbol : symbols) {
    shared_ptr<HuffmanNode> node(new HuffmanNode(symbol.first, symbol.second));
    nodes_.push_back(node);
  }

  //building the tree
  while (nodes_.size() > 1) {
    nodes_.sort(HuffmanComparator());

    auto left_son = nodes_.front();
    nodes_.pop_front();
    auto right_son = nodes_.front();
    nodes_.pop_front();

    shared_ptr<HuffmanNode> parent(new HuffmanNode(left_son, right_son));
    nodes_.push_back(parent);
  }

  auto root = nodes_.front();

  stringstream output;
  //saving decoded message
  for (auto& c : get_in_message().substr(static_cast<unsigned long>(amount * 16 + 8))) {
    if (c == '0') {
      root = root->get_left();
    }
    else if (c == '1') {
      root = root->get_right();
    }

    if (root->get_right() == nullptr &&
      root->get_left() == nullptr) {
      output << root->get_c() << flush;
      root = nodes_.front();
    }
  }
  set_out_message(output.str());

  cout << "decryption done!" << endl;
}